

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O1

O3DGCErrorCode
o3dgc::LoadIntACEGC(Vector<long> *data,unsigned_long M,BinaryStream *bstream,unsigned_long *iterator
                   )

{
  unsigned_long uVar1;
  uchar *puVar2;
  uint uVar3;
  unsigned_long uVar4;
  unsigned_long size;
  unsigned_long uVar5;
  ulong uVar6;
  Static_Bit_Model bModel0;
  Arithmetic_Codec acd;
  Adaptive_Bit_Model bModel1;
  Adaptive_Data_Model mModelValues;
  Static_Bit_Model local_cc;
  ulong local_c8;
  long local_c0;
  long local_b8;
  Arithmetic_Codec local_b0;
  Adaptive_Bit_Model local_7c;
  Adaptive_Data_Model local_68;
  
  local_c8 = M;
  uVar4 = BinaryStream::ReadUInt32Bin(bstream,iterator);
  size = BinaryStream::ReadUInt32Bin(bstream,iterator);
  if (size != 0) {
    local_c0 = uVar4 - 0xc;
    uVar5 = BinaryStream::ReadUInt32Bin(bstream,iterator);
    uVar1 = *iterator;
    puVar2 = (bstream->m_stream).m_buffer;
    *iterator = (uVar1 + uVar4) - 0xc;
    Vector<long>::Allocate(data,size);
    Arithmetic_Codec::Arithmetic_Codec(&local_b0);
    Arithmetic_Codec::set_buffer(&local_b0,(uint)local_c0,puVar2 + uVar1);
    Arithmetic_Codec::start_decoder(&local_b0);
    Adaptive_Data_Model::Adaptive_Data_Model(&local_68,(int)local_c8 + 2);
    Static_Bit_Model::Static_Bit_Model(&local_cc);
    Adaptive_Bit_Model::Adaptive_Bit_Model(&local_7c);
    do {
      uVar3 = Arithmetic_Codec::decode(&local_b0,&local_68);
      uVar6 = (ulong)uVar3;
      if (uVar6 == local_c8) {
        uVar3 = Arithmetic_Codec::ExpGolombDecode(&local_b0,0,&local_cc,&local_7c);
        uVar6 = uVar6 + uVar3;
      }
      local_b8 = uVar6 + (uVar5 - 0x7fffffff);
      Vector<long>::PushBack(data,&local_b8);
      size = size - 1;
    } while (size != 0);
    Adaptive_Data_Model::~Adaptive_Data_Model(&local_68);
    Arithmetic_Codec::~Arithmetic_Codec(&local_b0);
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    LoadIntACEGC(Vector<long> & data,
                                   const unsigned long M,
                                   const BinaryStream & bstream,
                                   unsigned long & iterator) 
    {
        unsigned long sizeSize = bstream.ReadUInt32Bin(iterator) - 12;
        unsigned long size     = bstream.ReadUInt32Bin(iterator);
        if (size == 0)
        {
            return O3DGC_OK;
        }
        long minValue   = bstream.ReadUInt32Bin(iterator) - O3DGC_MAX_LONG;
        unsigned char * buffer = 0;
        bstream.GetBuffer(iterator, buffer);
        iterator += sizeSize;
        data.Allocate(size);
        Arithmetic_Codec acd;
        acd.set_buffer(sizeSize, buffer);
        acd.start_decoder();
        Adaptive_Data_Model mModelValues(M+2);
        Static_Bit_Model bModel0;
        Adaptive_Bit_Model bModel1;
        unsigned long value;

#ifdef DEBUG_VERBOSE
        printf("-----------\nsize %i\n", size);
        fprintf(g_fileDebugTF, "size %i\n", size);
#endif //DEBUG_VERBOSE
        for(unsigned long i = 0; i < size; ++i)
        {
            value = acd.decode(mModelValues);
            if ( value == M)
            {
                value += acd.ExpGolombDecode(0, bModel0, bModel1);
            }
            data.PushBack(value + minValue);
#ifdef DEBUG_VERBOSE
            printf("%i\t%i\n", i, data[i]);
            fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
#endif //DEBUG_VERBOSE
        }
#ifdef DEBUG_VERBOSE
        fflush(g_fileDebugTF);
#endif //DEBUG_VERBOSE
        return O3DGC_OK;
    }